

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_tests.cpp
# Opt level: O2

void __thiscall
bloom_tests::bloom_create_insert_serialize_with_tweak::test_method
          (bloom_create_insert_serialize_with_tweak *this)

{
  readonly_property<bool> rVar1;
  bool bVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  long in_FS_OFFSET;
  Span<const_unsigned_char> vKey;
  const_string file;
  Span<const_unsigned_char> vKey_00;
  const_string file_00;
  Span<const_unsigned_char> vKey_01;
  Span<const_unsigned_char> vKey_02;
  const_string file_01;
  Span<const_unsigned_char> vKey_03;
  Span<const_unsigned_char> vKey_04;
  const_string file_02;
  Span<const_unsigned_char> vKey_05;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  check_type cVar5;
  char *local_1c8;
  char *local_1c0;
  assertion_result local_1b8;
  char *local_1a0;
  equal_coll_impl local_191;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  CBloomFilter filter;
  assertion_result local_88;
  array<std::byte,_13UL> expected;
  byte local_5b [3];
  _Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> local_58;
  char *pcStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  CBloomFilter::CBloomFilter(&filter,3,0.01,0x80000001,'\x01');
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x27b69bedd88a1099;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x45ca8b5ba80394d;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)CONCAT44(local_58._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,0xc850098f
                        );
  vKey.m_size = 0x14;
  vKey.m_data = (uchar *)&local_58;
  CBloomFilter::insert(&filter,vKey);
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x42;
  file.m_begin = (iterator)&local_c0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_d0,msg);
  local_88._0_8_ = 0x27b69bedd88a1099;
  local_88.m_message.px = (element_type *)0x45ca8b5ba80394d;
  local_88.m_message.pn.pi_._0_4_ = 0xc850098f;
  vKey_00.m_size = 0x14;
  vKey_00.m_data = (uchar *)&local_88;
  rVar1.super_class_property<bool>.value =
       (class_property<bool>)CBloomFilter::contains(&filter,vKey_00);
  local_1b8.m_message.px = (element_type *)0x0;
  local_1b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)local_58._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01148fd0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  pcStack_40 = "Bloom filter doesn\'t contain just-inserted object!";
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_d8 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  local_1b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar1.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            (&local_1b8,(lazy_ostream *)&local_58,1,1,WARN,_cVar5,(size_t)&local_e0,0x42);
  boost::detail::shared_count::~shared_count(&local_1b8.m_message.pn);
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x44;
  file_00.m_begin = (iterator)&local_f0;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_100,
             msg_00);
  local_88._0_8_ = 0x27b69bedd88a1019;
  local_88.m_message.px = (element_type *)0x45ca8b5ba80394d;
  local_88.m_message.pn.pi_._0_4_ = 0xc850098f;
  vKey_01.m_size = 0x14;
  vKey_01.m_data = (uchar *)&local_88;
  bVar2 = CBloomFilter::contains(&filter,vKey_01);
  local_1b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_1b8.m_message.px = (element_type *)0x0;
  local_1b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)local_58._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01149010;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  pcStack_40 = "Bloom filter contains something it shouldn\'t!";
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_108 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            (&local_1b8,(lazy_ostream *)&local_58,1,1,WARN,_cVar5,(size_t)&local_110,0x44);
  boost::detail::shared_count::~shared_count(&local_1b8.m_message.pn);
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x5846efd986c7a2b5;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x1b7ab31459ed7c28;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)CONCAT44(local_58._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,0xee2ea34a
                        );
  vKey_02.m_size = 0x14;
  vKey_02.m_data = (uchar *)&local_58;
  CBloomFilter::insert(&filter,vKey_02);
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x47;
  file_01.m_begin = (iterator)&local_120;
  msg_01.m_end = pvVar4;
  msg_01.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_130,
             msg_01);
  local_88._0_8_ = 0x5846efd986c7a2b5;
  local_88.m_message.px = (element_type *)0x1b7ab31459ed7c28;
  local_88.m_message.pn.pi_._0_4_ = 0xee2ea34a;
  vKey_03.m_size = 0x14;
  vKey_03.m_data = (uchar *)&local_88;
  local_1b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)CBloomFilter::contains(&filter,vKey_03);
  local_1b8.m_message.px = (element_type *)0x0;
  local_1b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)local_58._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01149050;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  pcStack_40 = "Bloom filter doesn\'t contain just-inserted object (2)!";
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_138 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            (&local_1b8,(lazy_ostream *)&local_58,1,1,WARN,_cVar5,(size_t)&local_140,0x47);
  boost::detail::shared_count::~shared_count(&local_1b8.m_message.pn);
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x6e36c5b4700630b9;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x75bc188b9e69b295;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)CONCAT44(local_58._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,0xc529f7e5
                        );
  vKey_04.m_size = 0x14;
  vKey_04.m_data = (uchar *)&local_58;
  CBloomFilter::insert(&filter,vKey_04);
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_148 = "";
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x4a;
  file_02.m_begin = (iterator)&local_150;
  msg_02.m_end = pvVar4;
  msg_02.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_160,
             msg_02);
  local_88._0_8_ = 0x6e36c5b4700630b9;
  local_88.m_message.px = (element_type *)0x75bc188b9e69b295;
  local_88.m_message.pn.pi_._0_4_ = 0xc529f7e5;
  vKey_05.m_size = 0x14;
  vKey_05.m_data = (uchar *)&local_88;
  local_1b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)CBloomFilter::contains(&filter,vKey_05);
  local_1b8.m_message.px = (element_type *)0x0;
  local_1b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)local_58._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01149050;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  pcStack_40 = "Bloom filter doesn\'t contain just-inserted object (3)!";
  local_170 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_168 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            (&local_1b8,(lazy_ostream *)&local_58,1,1,WARN,_cVar5,(size_t)&local_170,0x4a);
  boost::detail::shared_count::~shared_count(&local_1b8.m_message.pn);
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcStack_40 = (char *)0x0;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (byte *)0x0;
  CBloomFilter::SerializationOps<DataStream,CBloomFilter_const,ActionSerialize>(&filter);
  expected._M_elems[8] = 1;
  expected._M_elems[9] = 0;
  expected._M_elems[10] = 0;
  expected._M_elems[0xb] = 0x80;
  expected._M_elems[0xc] = 1;
  expected._M_elems[0] = 3;
  expected._M_elems[1] = 0xce;
  expected._M_elems[2] = 0x42;
  expected._M_elems[3] = 0x99;
  expected._M_elems[4] = 5;
  expected._M_elems[5] = 0;
  expected._M_elems[6] = 0;
  expected._M_elems[7] = 0;
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = &DAT_00000050;
  file_03.m_begin = (iterator)&local_180;
  msg_03.m_end = pvVar4;
  msg_03.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_190,
             msg_03);
  boost::test_tools::tt_detail::equal_coll_impl::operator()
            (&local_88,&local_191,
             (byte *)((long)local_58._M_impl.super__Vector_impl_data._M_start + (long)pcStack_40),
             (__normal_iterator<std::byte_*,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>
              )local_58._M_impl.super__Vector_impl_data._M_finish,expected._M_elems,local_5b);
  local_1b8.m_message.px = (element_type *)((ulong)local_1b8.m_message.px & 0xffffffffffffff00);
  local_1b8._0_8_ = &PTR__lazy_ostream_011480b0;
  local_1b8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1a0 = "";
  local_1c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_1c0 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_88,(lazy_ostream *)&local_1b8,1,0xd,4,0xb7b5b5,(size_t)&local_1c8,0x50,
             "stream.end()","expected.begin()","expected.end()");
  boost::detail::shared_count::~shared_count(&local_88.m_message.pn);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base(&local_58);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&filter);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(bloom_create_insert_serialize_with_tweak)
{
    // Same test as bloom_create_insert_serialize, but we add a nTweak of 100
    CBloomFilter filter(3, 0.01, 2147483649UL, BLOOM_UPDATE_ALL);

    filter.insert("99108ad8ed9bb6274d3980bab5a85c048f0950c8"_hex_u8);
    BOOST_CHECK_MESSAGE( filter.contains("99108ad8ed9bb6274d3980bab5a85c048f0950c8"_hex_u8), "Bloom filter doesn't contain just-inserted object!");
    // One bit different in first byte
    BOOST_CHECK_MESSAGE(!filter.contains("19108ad8ed9bb6274d3980bab5a85c048f0950c8"_hex_u8), "Bloom filter contains something it shouldn't!");

    filter.insert("b5a2c786d9ef4658287ced5914b37a1b4aa32eee"_hex_u8);
    BOOST_CHECK_MESSAGE(filter.contains("b5a2c786d9ef4658287ced5914b37a1b4aa32eee"_hex_u8), "Bloom filter doesn't contain just-inserted object (2)!");

    filter.insert("b9300670b4c5366e95b2699e8b18bc75e5f729c5"_hex_u8);
    BOOST_CHECK_MESSAGE(filter.contains("b9300670b4c5366e95b2699e8b18bc75e5f729c5"_hex_u8), "Bloom filter doesn't contain just-inserted object (3)!");

    DataStream stream{};
    stream << filter;

    constexpr auto expected{"03ce4299050000000100008001"_hex};
    BOOST_CHECK_EQUAL_COLLECTIONS(stream.begin(), stream.end(), expected.begin(), expected.end());
}